

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O2

CodeDescriptor * __thiscall
FastVector<BinaryCache::CodeDescriptor,_false,_false>::push_back
          (FastVector<BinaryCache::CodeDescriptor,_false,_false> *this)

{
  uint newSize;
  
  newSize = this->count;
  if (newSize == this->max) {
    grow(this,newSize);
    newSize = this->count;
  }
  this->count = newSize + 1;
  return this->data + newSize;
}

Assistant:

T* push_back()
	{
		if(count == max)
			grow(count);

		count++;

		return &data[count - 1];
	}